

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-select.c
# Opt level: O2

ssh_hash * sha1_select(ssh_hashalg *alg)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  ssh_hash *psVar5;
  long lVar6;
  
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 0x10) {
      __assert_fail("false && \"sha1_select ran off the end of its list\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha1-select.c"
                    ,0x24,"ssh_hash *sha1_select(const ssh_hashalg *)");
    }
    puVar1 = *(undefined8 **)((long)sha1_select::real_algs + lVar6);
    puVar2 = (undefined8 *)puVar1[10];
    if (*(char *)puVar2[1] == '\0') {
      bVar4 = (*(code *)*puVar2)();
      puVar3 = (undefined1 *)puVar2[1];
      puVar3[1] = bVar4;
      *puVar3 = 1;
    }
    else {
      bVar4 = ((char *)puVar2[1])[1] & 1;
    }
    if (bVar4 != 0) break;
    lVar6 = lVar6 + 8;
  }
  psVar5 = (ssh_hash *)(*(code *)*puVar1)(puVar1);
  if (psVar5 != (ssh_hash *)0x0) {
    (*psVar5->vt->reset)(psVar5);
  }
  return psVar5;
}

Assistant:

static ssh_hash *sha1_select(const ssh_hashalg *alg)
{
    static const ssh_hashalg *const real_algs[] = {
#if HAVE_SHA_NI
        &ssh_sha1_ni,
#endif
#if HAVE_NEON_CRYPTO
        &ssh_sha1_neon,
#endif
        &ssh_sha1_sw,
        NULL,
    };

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_hashalg *alg = real_algs[i];
        const struct sha1_extra *alg_extra =
            (const struct sha1_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_hash_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only SHA-1, which
     * is always available. */
    unreachable("sha1_select ran off the end of its list");
}